

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O1

void * rw::destroyNativeData(void *object,int32 offset,int32 size)

{
  void *pvVar1;
  
  if (*(undefined4 **)((long)object + 0x98) != (undefined4 *)0x0) {
    switch(**(undefined4 **)((long)object + 0x98)) {
    case 4:
      pvVar1 = ps2::destroyNativeData(object,offset,size);
      return pvVar1;
    case 5:
      pvVar1 = xbox::destroyNativeData(object,offset,size);
      return pvVar1;
    case 8:
      pvVar1 = d3d8::destroyNativeData(object,offset,size);
      return pvVar1;
    case 9:
      pvVar1 = d3d9::destroyNativeData(object,offset,size);
      return pvVar1;
    case 0xb:
      pvVar1 = wdgl::destroyNativeData(object,offset,size);
      return pvVar1;
    case 0xc:
      pvVar1 = gl3::destroyNativeData(object,offset,size);
      return pvVar1;
    }
  }
  return object;
}

Assistant:

static void*
destroyNativeData(void *object, int32 offset, int32 size)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return object;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::destroyNativeData(object, offset, size);
	if(geometry->instData->platform == PLATFORM_GL3)
		return gl3::destroyNativeData(object, offset, size);
	return object;
}